

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::api::json::
ExecuteDirectApi<cfd::api::json::DecodeRawTransactionRequest,cfd::api::json::DecodeRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
          *function)

{
  DecodeRawTransactionResponse response;
  DecodeRawTransactionRequest req;
  DecodeRawTransactionResponse *local_198;
  DecodeRawTransactionRequest *local_190 [4];
  DecodeRawTransactionResponse local_170;
  DecodeRawTransactionRequest local_a0;
  
  DecodeRawTransactionRequest::DecodeRawTransactionRequest(&local_a0);
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>::Deserialize
            (&local_a0.super_JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>,
             (string *)this);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&local_170);
  local_198 = &local_170;
  local_190[0] = &local_a0;
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(request_message,local_190,&local_198);
    core::JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>::Serialize_abi_cxx11_
              (__return_storage_ptr__,
               &local_170.super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>);
    DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&local_170);
    DecodeRawTransactionRequest::~DecodeRawTransactionRequest(&local_a0);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}